

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int get_layer_weights(Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights)

{
  string *__lhs;
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar2;
  InnerProduct *innerproduct;
  value_type *__x;
  
  __lhs = &layer->type;
  bVar1 = std::operator==(__lhs,"Convolution");
  if (bVar1) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
              (weights,(value_type *)
                       &layer[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    if (*(int *)&layer[1].type._M_dataplus._M_p == 0) {
      return extraout_EAX;
    }
    __x = (value_type *)&layer[2].one_blob_only;
  }
  else {
    bVar1 = std::operator==(__lhs,"ConvolutionDepthWise");
    if (bVar1) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (weights,(value_type *)
                         &layer[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (*(int *)&layer[1].type._M_dataplus._M_p == 0) {
        return extraout_EAX_00;
      }
      __x = (value_type *)&layer[2].support_tensor_storage;
    }
    else {
      bVar1 = std::operator==(__lhs,"InnerProduct");
      if (!bVar1) {
        iVar2 = fprintf(_stderr,"unexpected layer type %s in get_layer_weights\n",
                        (__lhs->_M_dataplus)._M_p);
        return iVar2;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (weights,(value_type *)&layer[1].name.field_2);
      if (*(int *)((long)&layer[1]._vptr_Layer + 4) == 0) {
        return extraout_EAX_01;
      }
      __x = (value_type *)
            &layer[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back(weights,__x);
  return extraout_EAX_02;
}

Assistant:

static int get_layer_weights(const ncnn::Layer* layer, std::vector<ncnn::Mat>& weights)
{
    if (layer->type == "Convolution")
    {
        ncnn::Convolution* convolution = (ncnn::Convolution*)layer;
        weights.push_back(convolution->weight_data);
        if (convolution->bias_term)
            weights.push_back(convolution->bias_data);
    }
    else if (layer->type == "ConvolutionDepthWise")
    {
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layer;
        weights.push_back(convolutiondepthwise->weight_data);
        if (convolutiondepthwise->bias_term)
            weights.push_back(convolutiondepthwise->bias_data);
    }
    else if (layer->type == "InnerProduct")
    {
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layer;
        weights.push_back(innerproduct->weight_data);
        if (innerproduct->bias_term)
            weights.push_back(innerproduct->bias_data);
    }
    else
    {
        fprintf(stderr, "unexpected layer type %s in get_layer_weights\n", layer->type.c_str());
        return -1;
    }

    return 0;
}